

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void process_text(CHAR_DATA *ch,char *text)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  PC_DATA *pPVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  char tbuf [4608];
  char obuf [9216];
  char rbuf [4608];
  
  bVar1 = str_cmp(text,"");
  if (!bVar1) {
    return;
  }
  bVar1 = str_cmp(text,"exit");
  if (bVar1) {
    bVar1 = str_cmp(text,"finish");
    if (!bVar1) {
      send_to_char("Saving changes and exiting...\n\r",ch);
      pPVar6 = ch->pcdata;
      if (pPVar6->end_fun != (DO_FUN *)0x0) {
        (*pPVar6->end_fun)(ch,pPVar6->entered_text);
        pPVar6 = ch->pcdata;
      }
      pPVar6->entering_text = false;
      pPVar6->end_fun = (DO_FUN *)0x0;
      return;
    }
    bVar1 = str_cmp(text,"backline");
    if (bVar1) {
      bVar1 = str_cmp(text,"show");
      if (bVar1) {
        if (*text != '\0') {
          obuf[0] = '\0';
          sVar5 = strlen(text);
          if (0x50 < sVar5) {
            strcpy(tbuf,text);
            sVar5 = strlen(text);
            for (uVar7 = 1; uVar7 <= sVar5 / 0x50; uVar7 = (ulong)((int)uVar7 + 1)) {
              uVar2 = (int)uVar7 * 0x50;
              for (uVar8 = uVar2;
                  (uVar3 = uVar2, uVar2 - 0xf < uVar8 && (uVar3 = uVar8, tbuf[uVar8] != ' '));
                  uVar8 = uVar8 - 1) {
              }
              uVar8 = 0;
              while( true ) {
                if (tbuf[uVar3 + 1 + uVar8] == '\0') break;
                rbuf[uVar8] = tbuf[uVar3 + 1 + uVar8];
                uVar8 = uVar8 + 1;
              }
              rbuf[uVar8] = '\0';
              tbuf[uVar3] = '\n';
              tbuf[uVar3 + 1] = '\r';
              tbuf[uVar3 + 2] = '\0';
              strcat(tbuf,rbuf);
            }
            send_to_char("Over 80 characters, wrapping line.\n\r",ch);
          }
          pPVar6 = ch->pcdata;
          pcVar9 = pPVar6->entered_text;
          if (pcVar9 != (char *)0x0) {
            strcat(obuf,pcVar9);
          }
          sVar5 = strlen(text);
          if (sVar5 < 0x50) {
            uVar8 = 0;
            do {
              if ((uint)sVar5 < uVar8) {
                strcat(obuf,text);
                goto LAB_002d3293;
              }
              uVar7 = (ulong)uVar8;
              uVar8 = uVar8 + 1;
            } while (text[uVar7] != '~');
          }
          else {
            strcat(obuf,tbuf);
            sVar5 = strlen(tbuf);
            uVar7 = 0;
            do {
              if (sVar5 < uVar7) goto LAB_002d3293;
              pcVar9 = tbuf + uVar7;
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (*pcVar9 != '~');
          }
          pcVar9 = "Tilde found, line will not be added.\n\r";
          goto LAB_002d32fc;
        }
        pcVar9 = "Add what?";
      }
      else {
        pcVar9 = ch->pcdata->entered_text;
      }
    }
    else {
      pPVar6 = ch->pcdata;
      pcVar9 = pPVar6->entered_text;
      if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
        strcpy(obuf,pcVar9);
        uVar7 = strlen(obuf);
        bVar1 = false;
        while (iVar4 = (int)uVar7, iVar4 != 0) {
          if (obuf[uVar7 & 0xffffffff] == '\r') {
            if (bVar1) {
              obuf[iVar4 + 1] = '\0';
              free_pstring(pPVar6->entered_text);
              pcVar9 = palloc_string(obuf);
              ch->pcdata->entered_text = pcVar9;
              pcVar9 = "Line deleted.";
              goto LAB_002d32fc;
            }
            iVar4 = iVar4 + -1;
            bVar1 = true;
          }
          uVar7 = (ulong)(iVar4 - 1);
        }
        obuf[0] = '\0';
        free_pstring(pPVar6->entered_text);
        pcVar9 = palloc_string(obuf);
        ch->pcdata->entered_text = pcVar9;
        send_to_char("Line deleted.",ch);
        pcVar9 = ch->pcdata->entered_text;
        goto LAB_002d32fc;
      }
      pcVar9 = "No lines left to remove.";
    }
  }
  else {
    pPVar6 = ch->pcdata;
    pPVar6->entering_text = false;
    *pPVar6->entered_text = '\0';
    ch->pcdata->end_fun = (DO_FUN *)0x0;
    pcVar9 = "Exiting without saving changes.\n\r";
  }
  send_to_char(pcVar9,ch);
  return;
LAB_002d3293:
  sVar5 = strlen(obuf);
  (obuf + sVar5)[0] = '\n';
  (obuf + sVar5)[1] = '\r';
  obuf[sVar5 + 2] = '\0';
  sVar5 = strlen(obuf);
  if (sVar5 < 0x2400) {
    free_pstring(pPVar6->entered_text);
    pcVar9 = palloc_string(obuf);
    ch->pcdata->entered_text = pcVar9;
    pcVar9 = "Line added.";
  }
  else {
    pcVar9 = "String exceeds buffer.\n\r";
  }
LAB_002d32fc:
  send_to_char(pcVar9,ch);
  return;
}

Assistant:

void process_text(CHAR_DATA *ch, char *text)
{
	char obuf[MSL * 2], tbuf[MSL], rbuf[MSL];
	bool found= false;
	unsigned int len, rcount, i, iloc;

	if (!str_cmp(text, ""))
		return;

	if (!str_cmp(text, "exit"))
	{
		ch->pcdata->entering_text= false;
		ch->pcdata->entered_text[0] = '\0';
		ch->pcdata->end_fun = nullptr;

		send_to_char("Exiting without saving changes.\n\r", ch);
		return;
	}

	if (!str_cmp(text, "finish"))
	{
		send_to_char("Saving changes and exiting...\n\r", ch);

		if (ch->pcdata->end_fun)
			(*ch->pcdata->end_fun)(ch, ch->pcdata->entered_text);

		ch->pcdata->entering_text= false;
		ch->pcdata->end_fun = nullptr;
		return;
	}

	if (!str_cmp(text, "backline"))
	{
		if (ch->pcdata->entered_text == nullptr || ch->pcdata->entered_text[0] == '\0')
		{
			send_to_char("No lines left to remove.", ch);
			return;
		}

		strcpy(obuf, ch->pcdata->entered_text);

		for (len = strlen(obuf); len > 0; len--)
		{
			if (obuf[len] == '\r')
			{
				if (!found)
				{
					if (len > 0)
						len--;

					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';

					free_pstring(ch->pcdata->entered_text);
					ch->pcdata->entered_text = palloc_string(obuf);

					send_to_char("Line deleted.", ch);
					return;
				}
			}
		}

		obuf[0] = '\0';

		free_pstring(ch->pcdata->entered_text);
		ch->pcdata->entered_text = palloc_string(obuf);

		send_to_char("Line deleted.", ch);
		send_to_char(ch->pcdata->entered_text, ch);
		return;
	}

	if (!str_cmp(text, "show"))
	{
		send_to_char(ch->pcdata->entered_text, ch);
		return;
	}

	if (text[0] != '\0')
	{
		obuf[0] = '\0';

		if (strlen(text) > 80)
		{
			sprintf(tbuf, "%s", text);

			for (i = 1; i <= strlen(text) / 80; i++)
			{
				for (rcount = 80 * i; rcount > (80 * i) - 15; rcount--)
				{
					if (tbuf[rcount] == ' ')
						break;
				}

				if (rcount <= (80 * i) - 15)
					rcount = 80 * i;

				for (iloc = rcount; tbuf[iloc + 1]; iloc++)
				{
					rbuf[iloc - rcount] = tbuf[iloc + 1];
				}

				rbuf[iloc - rcount] = '\0';
				tbuf[rcount] = '\n';
				tbuf[rcount + 1] = '\r';
				tbuf[rcount + 2] = '\0';
				strcat(tbuf, rbuf);
			}

			send_to_char("Over 80 characters, wrapping line.\n\r", ch);
		}

		if (ch->pcdata->entered_text)
			strcat(obuf, ch->pcdata->entered_text);

		if (strlen(text) < 80)
		{
			for (i = 0; i <= strlen(text); i++)
			{
				if (text[i] == '~')
				{
					send_to_char("Tilde found, line will not be added.\n\r", ch);
					return;
				}
			}

			strcat(obuf, text);
		}
		else
		{
			strcat(obuf, tbuf);

			for (i = 0; i <= strlen(tbuf); i++)
			{
				if (tbuf[i] == '~')
				{
					send_to_char("Tilde found, line will not be added.\n\r", ch);
					return;
				}
			}
		}

		strcat(obuf, "\n\r");

		if (strlen(obuf) >= MSL * 2)
		{
			send_to_char("String exceeds buffer.\n\r", ch);
			return;
		}

		free_pstring(ch->pcdata->entered_text);
		ch->pcdata->entered_text = palloc_string(obuf);
	}
	else if (text[0] == '\0')
	{
		send_to_char("Add what?", ch);
		return;
	}

	send_to_char("Line added.", ch);
	return;
}